

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

void __thiscall calculator::ExpressionParser<__int128>::eatSpaces(ExpressionParser<__int128> *this)

{
  char cVar1;
  int iVar2;
  long in_RDI;
  ExpressionParser<__int128> *in_stack_ffffffffffffffe8;
  
  while( true ) {
    cVar1 = getCharacter(in_stack_ffffffffffffffe8);
    iVar2 = isspace((int)cVar1);
    if (iVar2 == 0) break;
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  }
  return;
}

Assistant:

void eatSpaces()
  {
    while (std::isspace(getCharacter()) != 0)
      index_++;
  }